

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

set<uint256,_std::less<uint256>,_std::allocator<uint256>_> * __thiscall
wallet::CWallet::GetTxConflicts
          (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *__return_storage_ptr__,
          CWallet *this,CWalletTx *wtx)

{
  element_type *peVar1;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<uint256>,_std::_Rb_tree_iterator<uint256>_> pVar2;
  uint256 myHash;
  uint256 local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (wtx->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  local_38.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  local_38.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  local_38.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((long)(peVar1->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  GetConflicts(__return_storage_ptr__,this,&local_38);
  pVar2 = std::
          _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
          ::equal_range(&__return_storage_ptr__->_M_t,&local_38);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::_M_erase_aux(&__return_storage_ptr__->_M_t,(_Base_ptr)pVar2.first._M_node,
                 (_Base_ptr)pVar2.second._M_node);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::set<uint256> CWallet::GetTxConflicts(const CWalletTx& wtx) const
{
    AssertLockHeld(cs_wallet);

    const uint256 myHash{wtx.GetHash()};
    std::set<uint256> result{GetConflicts(myHash)};
    result.erase(myHash);
    return result;
}